

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void sysbvm_jit_callWithContextNoResult0(sysbvm_bytecodeJit_t *jit,void *functionPointer)

{
  uint8_t local_17 [7];
  
  sysbvm_bytecodeJit_addBytes(jit,7,local_17);
  sysbvm_jit_x86_call(jit,functionPointer);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_callWithContextNoResult0(sysbvm_bytecodeJit_t *jit, void *functionPointer)
{
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_call(jit, functionPointer);
}